

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrace.cpp
# Opt level: O0

UBool utrace_cleanup_63(void)

{
  pTraceEntryFunc = (UTraceEntry *)0x0;
  pTraceExitFunc = (UTraceExit *)0x0;
  pTraceDataFunc = (UTraceData *)0x0;
  utrace_level = -1;
  gTraceContext = (void *)0x0;
  return '\x01';
}

Assistant:

U_CFUNC UBool 
utrace_cleanup() {
    pTraceEntryFunc = NULL;
    pTraceExitFunc  = NULL;
    pTraceDataFunc  = NULL;
    utrace_level    = UTRACE_OFF;
    gTraceContext   = NULL;
    return TRUE;
}